

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

bool __thiscall smf::MidiFile::writeBinascWithComments(MidiFile *this,string *filename)

{
  char cVar1;
  ostream *poVar2;
  undefined1 uVar3;
  fstream output;
  ostream local_210 [512];
  
  std::fstream::fstream(&output,(filename->_M_dataplus)._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: could not write: ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar3 = 0;
  }
  else {
    writeBinascWithComments(this,local_210);
    this->m_rwstatus = true;
    std::fstream::close();
    uVar3 = this->m_rwstatus;
  }
  std::fstream::~fstream(&output);
  return (bool)uVar3;
}

Assistant:

bool MidiFile::writeBinascWithComments(const std::string& filename) {
	std::fstream output(filename.c_str(), std::ios::out);

	if (!output.is_open()) {
		std::cerr << "Error: could not write: " << filename << std::endl;
		return 0;
	}
	m_rwstatus = writeBinascWithComments(output);
	output.close();
	return m_rwstatus;
}